

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int print_keyword(yang_token keyword,yang_arg arg,FILE *out,int level,FILE *in,char **buf,
                 int *buf_len)

{
  byte bVar1;
  yang_token yVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char cVar9;
  char *ptr;
  yang_arg local_48;
  uint local_44;
  yang_arg arg_local;
  FILE *local_38;
  
  local_48 = arg;
  local_38 = (FILE *)out;
  switch(keyword) {
  case YANG_ANYXML:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<anyxml name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "anyxml";
    break;
  case YANG_ARGUMENT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<argument name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "argument";
    break;
  case YANG_AUGMENT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<augment target-node=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "augment";
    break;
  case YANG_BASE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<base name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "base";
    break;
  case YANG_BELONGS_TO:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<belongs-to module=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "belongs-to";
    break;
  case YANG_BIT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<bit name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "bit";
    break;
  case YANG_CASE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<case name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "case";
    break;
  case YANG_CHOICE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<choice name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "choice";
    break;
  case YANG_CONFIG:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<config value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "config";
    break;
  case YANG_CONTACT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<contact>\n",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "contact";
    goto LAB_001042e4;
  case YANG_CONTAINER:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<container name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "container";
    break;
  case YANG_DEFAULT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<default value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "default";
    break;
  case YANG_DESCRIPTION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<description>\n",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "description";
    goto LAB_001042e4;
  case YANG_DEVIATE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<deviate value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "deviate";
    break;
  case YANG_DEVIATION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<deviation target-node=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "deviation";
    break;
  case YANG_ENUM:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<enum name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "enum";
    break;
  case YANG_ERROR_APP_TAG:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<error-app-tag value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "error-app-tag";
    break;
  case YANG_ERROR_MESSAGE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<error-message>\n",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "error-message";
    uVar4 = 0;
    pcVar6 = "value";
    goto LAB_001047b7;
  case YANG_EXTENSION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<extension name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "extension";
    break;
  case YANG_FEATURE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<feature name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "feature";
    break;
  case YANG_FRACTION_DIGITS:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<fraction-digits value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "fraction-digits";
    break;
  case YANG_GROUPING:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<grouping name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "grouping";
    break;
  case YANG_IDENTITY:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<identity name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "identity";
    break;
  case YANG_IF_FEATURE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<if-feature name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "if-feature";
    break;
  case YANG_IMPORT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<import module=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "import";
    break;
  case YANG_INCLUDE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<include module=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "include";
    break;
  case YANG_INPUT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<input",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "input";
    break;
  case YANG_KEY:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<key value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "key";
    break;
  case YANG_LEAF:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<leaf name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "leaf";
    break;
  case YANG_LEAF_LIST:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<leaf-list name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "leaf-list";
    break;
  case YANG_LENGTH:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<length value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "length";
    break;
  case YANG_LIST:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<list name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "list";
    break;
  case YANG_MANDATORY:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<mandatory value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "mandatory";
    break;
  case YANG_MAX_ELEMENTS:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<max-elements value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "max-elements";
    break;
  case YANG_MIN_ELEMENTS:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<min-elements value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "min-elements";
    break;
  default:
    print_keyword_cold_2();
    return -1;
  case YANG_MUST:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<must condition=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "must";
    break;
  case YANG_NAMESPACE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<namespace uri=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "namespace";
    break;
  case YANG_NOTIFICATION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<notification name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "notification";
    break;
  case YANG_ORDERED_BY:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<ordered-by value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "ordered-by";
    break;
  case YANG_ORGANIZATION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<organization>\n",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "organization";
    goto LAB_001042e4;
  case YANG_OUTPUT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<output",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "output";
    break;
  case YANG_PATH:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<path value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "path";
    break;
  case YANG_PATTERN:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<pattern value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "pattern";
    break;
  case YANG_POSITION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    pcVar7 = "%*s<position value=\"";
    goto LAB_00103f6c;
  case YANG_PREFIX:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<prefix value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "prefix";
    break;
  case YANG_PRESENCE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<presence value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "presence";
    break;
  case YANG_RANGE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<range value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "range";
    break;
  case YANG_REFERENCE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<reference>\n",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "reference";
LAB_001042e4:
    uVar4 = 0;
    pcVar6 = "text";
    goto LAB_001047b7;
  case YANG_REFINE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<refine target-node=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "refine";
    break;
  case YANG_REQUIRE_INSTANCE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<require-instance value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "require-instance";
    break;
  case YANG_REVISION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<revision date=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "revision";
    break;
  case YANG_REVISION_DATE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<revision-date date=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "revision-date";
    break;
  case YANG_RPC:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<rpc name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "rpc";
    break;
  case YANG_STATUS:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<status value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "status";
    break;
  case YANG_TYPE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<type name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "type";
    break;
  case YANG_TYPEDEF:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<typedef name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "typedef";
    break;
  case YANG_UNIQUE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<unique tag=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "unique";
    break;
  case YANG_UNITS:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<units name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "units";
    break;
  case YANG_USES:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<uses name=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "uses";
    break;
  case YANG_VALUE:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    pcVar7 = "%*s<value value=\"";
LAB_00103f6c:
    fprintf((FILE *)out,pcVar7,(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "value";
    break;
  case YANG_WHEN:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<when condition=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "condition";
    break;
  case YANG_YANG_VERSION:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<yang-version value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "yang-version";
    break;
  case YANG_YIN_ELEMENT:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<yin-element value=\"",(ulong)(uint)(level * 2),pcVar6);
    _arg_local = "yin-element";
    break;
  case YANG_CUSTOM:
    pcVar6 = " ";
    if (level == 0) {
      pcVar6 = "";
    }
    fprintf((FILE *)out,"%*s<%s",(ulong)(uint)(level * 2),pcVar6,*buf);
    _arg_local = "!!error!!";
  }
  pcVar6 = (char *)0x0;
  uVar4 = CONCAT71((int7)((ulong)_arg_local >> 8),1);
LAB_001047b7:
  local_44 = (uint)uVar4;
  if ((char)uVar4 == '\0') {
    level = level + 1;
    pcVar7 = " ";
    if (level == 0) {
      pcVar7 = "";
    }
    fprintf(local_38,"%*s<%s>",(ulong)(uint)(level * 2),pcVar7,pcVar6);
    uVar4 = (ulong)local_44;
  }
  cVar9 = (char)uVar4;
  if (arg == Y_STR_ARG) {
    pbVar5 = (byte *)get_word(in,buf,buf_len);
    if (pbVar5 != (byte *)0x0) {
      if ((char)local_44 == '\0') {
        do {
          bVar1 = *pbVar5;
          if (bVar1 < 0x3c) {
            if (bVar1 == 0x26) {
              pcVar7 = "&amp;";
              goto LAB_0010491e;
            }
            if (bVar1 == 0) goto LAB_0010493e;
LAB_0010492d:
            fputc((int)(char)bVar1,local_38);
          }
          else {
            if (bVar1 == 0x3e) {
              pcVar7 = "&gt;";
            }
            else {
              if (bVar1 != 0x3c) goto LAB_0010492d;
              pcVar7 = "&lt;";
            }
LAB_0010491e:
            fputs(pcVar7,local_38);
          }
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      do {
        bVar1 = *pbVar5;
        if (bVar1 < 0x3c) {
          if (bVar1 == 0x22) {
            pcVar7 = "&quot;";
            goto LAB_001048c4;
          }
          if (bVar1 == 0x26) {
            pcVar7 = "&amp;";
            goto LAB_001048c4;
          }
          if (bVar1 == 0) goto LAB_0010493e;
LAB_001048d6:
          fputc((int)(char)bVar1,local_38);
        }
        else {
          if (bVar1 == 0x3e) {
            pcVar7 = "&gt;";
          }
          else {
            if (bVar1 != 0x3c) goto LAB_001048d6;
            pcVar7 = "&lt;";
          }
LAB_001048c4:
          fputs(pcVar7,local_38);
        }
        pbVar5 = pbVar5 + 1;
      } while( true );
    }
  }
  else {
    if (arg == Y_IDENTIF_ARG) {
      pcVar7 = get_word(in,buf,buf_len);
      if (pcVar7 == (char *)0x0) {
        return -1;
      }
      pcVar8 = "";
      cVar9 = (char)local_44;
      if (cVar9 != '\0') {
        pcVar8 = "\"";
      }
      fprintf(local_38,"%s%s",pcVar7,pcVar8);
    }
LAB_00104965:
    if (cVar9 == '\0') {
LAB_00104969:
      fprintf(local_38,"</%s>\n",pcVar6);
      level = level + -1;
    }
    pcVar6 = get_word(in,buf,buf_len);
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
    yVar2 = get_keyword(pcVar6,&local_48);
    if (yVar2 == YANG_LEFT_BRACE) {
      if ((char)local_44 != '\0') {
        fwrite(">\n",2,1,local_38);
      }
      do {
        pcVar6 = get_word(in,buf,buf_len);
        if (pcVar6 == (char *)0x0) {
          return -1;
        }
        yVar2 = get_keyword(pcVar6,&local_48);
        if (yVar2 == YANG_RIGHT_BRACE) {
          pcVar6 = " ";
          if (level == 0) {
            pcVar6 = "";
          }
          fprintf(local_38,"%*s</%s>\n",(ulong)(uint)(level * 2),pcVar6,_arg_local);
          yVar2 = YANG_RIGHT_BRACE;
          goto LAB_00104aa2;
        }
        if (yVar2 == YANG_UNKNOWN) {
          fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar6);
          return -1;
        }
        iVar3 = print_keyword(yVar2,local_48,(FILE *)local_38,level + 1,in,buf,buf_len);
      } while (iVar3 == 0);
    }
    else {
      if (yVar2 == YANG_UNKNOWN) {
        fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar6);
        return -1;
      }
LAB_00104aa2:
      if (yVar2 == YANG_SEMICOLON) {
        if ((char)local_44 == '\0') {
          pcVar6 = " ";
          if (level == 0) {
            pcVar6 = "";
          }
          fprintf(local_38,"%*s</%s>\n",(ulong)(uint)(level * 2),pcVar6,_arg_local);
          return 0;
        }
        fwrite("/>\n",3,1,local_38);
        return 0;
      }
      if (yVar2 == YANG_RIGHT_BRACE) {
        return 0;
      }
      print_keyword_cold_1();
    }
  }
  return -1;
LAB_0010493e:
  if ((char)local_44 != '\0') {
    fputc(0x22,local_38);
    cVar9 = (char)local_44;
    goto LAB_00104965;
  }
  goto LAB_00104969;
}

Assistant:

static int
print_keyword(enum yang_token keyword, enum yang_arg arg, FILE *out, int level, FILE *in, char **buf, int *buf_len)
{
    char *word;
    const char *yin_element = NULL, *close_tag;

    switch (keyword) {
    case YANG_ANYXML:
        fprintf(out, "%*s<anyxml name=\"", LEVEL(level), INDENT(level));
        close_tag = "anyxml";
        break;
    case YANG_ARGUMENT:
        fprintf(out, "%*s<argument name=\"", LEVEL(level), INDENT(level));
        close_tag = "argument";
        break;
    case YANG_AUGMENT:
        fprintf(out, "%*s<augment target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "augment";
        break;
    case YANG_BASE:
        fprintf(out, "%*s<base name=\"", LEVEL(level), INDENT(level));
        close_tag = "base";
        break;
    case YANG_BELONGS_TO:
        fprintf(out, "%*s<belongs-to module=\"", LEVEL(level), INDENT(level));
        close_tag = "belongs-to";
        break;
    case YANG_BIT:
        fprintf(out, "%*s<bit name=\"", LEVEL(level), INDENT(level));
        close_tag = "bit";
        break;
    case YANG_CASE:
        fprintf(out, "%*s<case name=\"", LEVEL(level), INDENT(level));
        close_tag = "case";
        break;
    case YANG_CHOICE:
        fprintf(out, "%*s<choice name=\"", LEVEL(level), INDENT(level));
        close_tag = "choice";
        break;
    case YANG_CONFIG:
        fprintf(out, "%*s<config value=\"", LEVEL(level), INDENT(level));
        close_tag = "config";
        break;
    case YANG_CONTACT:
        fprintf(out, "%*s<contact>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "contact";
        break;
    case YANG_CONTAINER:
        fprintf(out, "%*s<container name=\"", LEVEL(level), INDENT(level));
        close_tag = "container";
        break;
    case YANG_DEFAULT:
        fprintf(out, "%*s<default value=\"", LEVEL(level), INDENT(level));
        close_tag = "default";
        break;
    case YANG_DESCRIPTION:
        fprintf(out, "%*s<description>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "description";
        break;
    case YANG_DEVIATE:
        fprintf(out, "%*s<deviate value=\"", LEVEL(level), INDENT(level));
        close_tag = "deviate";
        break;
    case YANG_DEVIATION:
        fprintf(out, "%*s<deviation target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "deviation";
        break;
    case YANG_ENUM:
        fprintf(out, "%*s<enum name=\"", LEVEL(level), INDENT(level));
        close_tag = "enum";
        break;
    case YANG_ERROR_APP_TAG:
        fprintf(out, "%*s<error-app-tag value=\"", LEVEL(level), INDENT(level));
        close_tag = "error-app-tag";
        break;
    case YANG_ERROR_MESSAGE:
        fprintf(out, "%*s<error-message>\n", LEVEL(level), INDENT(level));
        yin_element = "value";
        close_tag = "error-message";
        break;
    case YANG_EXTENSION:
        fprintf(out, "%*s<extension name=\"", LEVEL(level), INDENT(level));
        close_tag = "extension";
        break;
    case YANG_FEATURE:
        fprintf(out, "%*s<feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "feature";
        break;
    case YANG_FRACTION_DIGITS:
        fprintf(out, "%*s<fraction-digits value=\"", LEVEL(level), INDENT(level));
        close_tag = "fraction-digits";
        break;
    case YANG_GROUPING:
        fprintf(out, "%*s<grouping name=\"", LEVEL(level), INDENT(level));
        close_tag = "grouping";
        break;
    case YANG_IDENTITY:
        fprintf(out, "%*s<identity name=\"", LEVEL(level), INDENT(level));
        close_tag = "identity";
        break;
    case YANG_IF_FEATURE:
        fprintf(out, "%*s<if-feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "if-feature";
        break;
    case YANG_IMPORT:
        fprintf(out, "%*s<import module=\"", LEVEL(level), INDENT(level));
        close_tag = "import";
        break;
    case YANG_INCLUDE:
        fprintf(out, "%*s<include module=\"", LEVEL(level), INDENT(level));
        close_tag = "include";
        break;
    case YANG_INPUT:
        fprintf(out, "%*s<input", LEVEL(level), INDENT(level));
        close_tag = "input";
        break;
    case YANG_KEY:
        fprintf(out, "%*s<key value=\"", LEVEL(level), INDENT(level));
        close_tag = "key";
        break;
    case YANG_LEAF:
        fprintf(out, "%*s<leaf name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf";
        break;
    case YANG_LEAF_LIST:
        fprintf(out, "%*s<leaf-list name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf-list";
        break;
    case YANG_LENGTH:
        fprintf(out, "%*s<length value=\"", LEVEL(level), INDENT(level));
        close_tag = "length";
        break;
    case YANG_LIST:
        fprintf(out, "%*s<list name=\"", LEVEL(level), INDENT(level));
        close_tag = "list";
        break;
    case YANG_MANDATORY:
        fprintf(out, "%*s<mandatory value=\"", LEVEL(level), INDENT(level));
        close_tag = "mandatory";
        break;
    case YANG_MAX_ELEMENTS:
        fprintf(out, "%*s<max-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "max-elements";
        break;
    case YANG_MIN_ELEMENTS:
        fprintf(out, "%*s<min-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "min-elements";
        break;
    case YANG_MUST:
        fprintf(out, "%*s<must condition=\"", LEVEL(level), INDENT(level));
        close_tag = "must";
        break;
    case YANG_NAMESPACE:
        fprintf(out, "%*s<namespace uri=\"", LEVEL(level), INDENT(level));
        close_tag = "namespace";
        break;
    case YANG_NOTIFICATION:
        fprintf(out, "%*s<notification name=\"", LEVEL(level), INDENT(level));
        close_tag = "notification";
        break;
    case YANG_ORDERED_BY:
        fprintf(out, "%*s<ordered-by value=\"", LEVEL(level), INDENT(level));
        close_tag = "ordered-by";
        break;
    case YANG_ORGANIZATION:
        fprintf(out, "%*s<organization>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "organization";
        break;
    case YANG_OUTPUT:
        fprintf(out, "%*s<output", LEVEL(level), INDENT(level));
        close_tag = "output";
        break;
    case YANG_PATH:
        fprintf(out, "%*s<path value=\"", LEVEL(level), INDENT(level));
        close_tag = "path";
        break;
    case YANG_PATTERN:
        fprintf(out, "%*s<pattern value=\"", LEVEL(level), INDENT(level));
        close_tag = "pattern";
        break;
    case YANG_POSITION:
        fprintf(out, "%*s<position value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_PREFIX:
        fprintf(out, "%*s<prefix value=\"", LEVEL(level), INDENT(level));
        close_tag = "prefix";
        break;
    case YANG_PRESENCE:
        fprintf(out, "%*s<presence value=\"", LEVEL(level), INDENT(level));
        close_tag = "presence";
        break;
    case YANG_RANGE:
        fprintf(out, "%*s<range value=\"", LEVEL(level), INDENT(level));
        close_tag = "range";
        break;
    case YANG_REFERENCE:
        fprintf(out, "%*s<reference>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "reference";
        break;
    case YANG_REFINE:
        fprintf(out, "%*s<refine target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "refine";
        break;
    case YANG_REQUIRE_INSTANCE:
        fprintf(out, "%*s<require-instance value=\"", LEVEL(level), INDENT(level));
        close_tag = "require-instance";
        break;
    case YANG_REVISION:
        fprintf(out, "%*s<revision date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision";
        break;
    case YANG_REVISION_DATE:
        fprintf(out, "%*s<revision-date date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision-date";
        break;
    case YANG_RPC:
        fprintf(out, "%*s<rpc name=\"", LEVEL(level), INDENT(level));
        close_tag = "rpc";
        break;
    case YANG_STATUS:
        fprintf(out, "%*s<status value=\"", LEVEL(level), INDENT(level));
        close_tag = "status";
        break;
    case YANG_TYPE:
        fprintf(out, "%*s<type name=\"", LEVEL(level), INDENT(level));
        close_tag = "type";
        break;
    case YANG_TYPEDEF:
        fprintf(out, "%*s<typedef name=\"", LEVEL(level), INDENT(level));
        close_tag = "typedef";
        break;
    case YANG_UNIQUE:
        fprintf(out, "%*s<unique tag=\"", LEVEL(level), INDENT(level));
        close_tag = "unique";
        break;
    case YANG_UNITS:
        fprintf(out, "%*s<units name=\"", LEVEL(level), INDENT(level));
        close_tag = "units";
        break;
    case YANG_USES:
        fprintf(out, "%*s<uses name=\"", LEVEL(level), INDENT(level));
        close_tag = "uses";
        break;
    case YANG_VALUE:
        fprintf(out, "%*s<value value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_WHEN:
        fprintf(out, "%*s<when condition=\"", LEVEL(level), INDENT(level));
        close_tag = "condition";
        break;
    case YANG_YANG_VERSION:
        fprintf(out, "%*s<yang-version value=\"", LEVEL(level), INDENT(level));
        close_tag = "yang-version";
        break;
    case YANG_YIN_ELEMENT:
        fprintf(out, "%*s<yin-element value=\"", LEVEL(level), INDENT(level));
        close_tag = "yin-element";
        break;
    case YANG_CUSTOM:
        /* it must still be stored in buf */
        fprintf(out, "%*s<%s", LEVEL(level), INDENT(level), *buf);
        /* will be printed in case of some nested extension elements, we don't support that */
        close_tag = "!!error!!";
        break;
    default:
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }

    /* keyword followed by a child element */
    if (yin_element) {
        ++level;
        fprintf(out, "%*s<%s>", LEVEL(level), INDENT(level), yin_element);
    }

    /* keyword argument */
    switch (arg) {
    case Y_IDENTIF_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }

        /* word is the identifier (after some changes) */
        fprintf(out, "%s%s", word, (yin_element ? "" : "\""));
        break;

    case Y_STR_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }
        /* word is the string */
        if (yin_element) {
            print_text_xml_encode(out, word);
        } else {
            print_attr_val_xml_encode(out, word);
        }

        if (!yin_element) {
            fprintf(out, "\"");
        }
        break;

    case Y_NO_ARG:
        break;
    }

    if (yin_element) {
        fprintf(out, "</%s>\n", yin_element);
        --level;
    }

    word = get_word(in, buf, buf_len);
    if (!word) {
        return -1;
    }
    keyword = get_keyword(word, &arg);
    if (!keyword) {
        fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
        return -1;
    }

    if (keyword == YANG_LEFT_BRACE) {
        if (!yin_element) {
            fprintf(out, ">\n");
        }

        while (1) {
            word = get_word(in, buf, buf_len);
            if (!word) {
                return -1;
            }
            keyword = get_keyword(word, &arg);
            if (!keyword) {
                fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
                return -1;
            }

            if (keyword == YANG_RIGHT_BRACE) {
                break;
            }

            if (print_keyword(keyword, arg, out, level + 1, in, buf, buf_len)) {
                return -1;
            }
        }

        fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
    }
    if ((keyword != YANG_SEMICOLON) && (keyword != YANG_RIGHT_BRACE)) {
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }
    if (keyword == YANG_SEMICOLON) {
        if (yin_element) {
            fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
        } else {
            fprintf(out, "/>\n");
        }
    }

    return 0;
}